

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTest.cpp
# Opt level: O0

int LogTest(int argc,char **argv)

{
  LogFileMethod argv_00;
  size_t inMessageSize;
  allocator<char> local_c4d1;
  string local_c4d0;
  string local_c4b0;
  undefined1 local_c490 [8];
  Trace trace;
  char *aString;
  string local_f0;
  allocator<char> local_b9;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  Log log;
  char **argv_local;
  int argc_local;
  
  log.mLogMethod = (LogFileMethod)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"logTest.txt",&local_b9);
  BuildRelativeOutputPath(&local_98,argv,&local_b8);
  Log::Log((Log *)local_78,&local_98,true);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"testing wide string input",(allocator<char> *)((long)&aString + 7)
            );
  Log::LogEntry((Log *)local_78,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&aString + 7));
  trace._50056_8_ = anon_var_dwarf_92ea3;
  inMessageSize = strlen("testing Byte input");
  Log::LogEntry((Log *)local_78,(Byte *)"testing Byte input",inMessageSize);
  Trace::Trace((Trace *)local_c490);
  argv_00 = log.mLogMethod;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c4d0,"traceTest.txt",&local_c4d1);
  BuildRelativeOutputPath(&local_c4b0,(char **)argv_00,&local_c4d0);
  Trace::SetLogSettings((Trace *)local_c490,&local_c4b0,true,true);
  std::__cxx11::string::~string((string *)&local_c4b0);
  std::__cxx11::string::~string((string *)&local_c4d0);
  std::allocator<char>::~allocator(&local_c4d1);
  Trace::TraceToLog((Trace *)local_c490,"Tracing number %d %d",10,0x14);
  Trace::TraceToLog((Trace *)local_c490,"Tracing some other items %s 0x%x","hello",0x14);
  Trace::~Trace((Trace *)local_c490);
  Log::~Log((Log *)local_78);
  return 0;
}

Assistant:

int LogTest(int argc, char* argv[])
{
	Log log(BuildRelativeOutputPath(argv,"logTest.txt"),true);

	log.LogEntry("testing wide string input");

	const char* aString = "testing Byte input";

	log.LogEntry((const Byte*)aString,strlen(aString));


	Trace trace;

	trace.SetLogSettings(BuildRelativeOutputPath(argv,"traceTest.txt"),true,true);
	trace.TraceToLog("Tracing number %d %d",10,20);
	trace.TraceToLog("Tracing some other items %s 0x%x","hello",20);

	return 0;
}